

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fnv.cpp
# Opt level: O3

void __thiscall Fnv_StandardVectors_Test::~Fnv_StandardVectors_Test(Fnv_StandardVectors_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (Fnv, StandardVectors) {
    auto test_num = 1; // test vector that failed, starting at 1.
    for (test_vector const * t = fnv_test_str; t->buf != nullptr; ++t, ++test_num) {
        auto const * const first = reinterpret_cast<std::uint8_t const *> (t->buf);
        std::uint64_t const hval = pstore::fnv_64a_buf (
            pstore::gsl::make_span (first, first + t->len));
        EXPECT_EQ (hval, fnv1a_64_vector[test_num - 1].fnv1a_64) << "failed test # " << test_num;
    }
}